

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O0

void __thiscall cinatra::http_parser::parse_body_len(http_parser *this)

{
  bool bVar1;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> key;
  __integer_from_chars_result_type<long> _Var2;
  char *ptr;
  string_view header_value;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc8;
  int __base;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  string_view local_18;
  
  __base = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  key = sv(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_18 = get_header_value((http_parser *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),key);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (bVar1) {
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
    _Var2 = std::from_chars<long>
                      (key._M_str,(char *)key._M_len,
                       (long *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),__base)
    ;
    if (_Var2.ec != 0) {
      *(undefined8 *)(in_RDI + 0x28) = 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

void parse_body_len() {
    auto header_value = this->get_header_value("content-length"sv);
    if (header_value.empty()) {
      body_len_ = 0;
    }
    else {
      auto [ptr, ec] = std::from_chars(
          header_value.data(), header_value.data() + header_value.size(),
          body_len_, 10);
      if (ec != std::errc{}) {
        body_len_ = -1;
      }
    }
  }